

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_test.cpp
# Opt level: O2

void testSetGetHelpText_ShouldSucceed(void)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_6a;
  allocator<char> local_69;
  Argengine ae;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  string local_28 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"test",&local_69);
  __l._M_len = 1;
  __l._M_array = &local_60;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_40,__l,&local_6a);
  juzzlin::Argengine::Argengine(&ae,&local_40,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  juzzlin::Argengine::helpText_abi_cxx11_();
  bVar1 = std::operator==(&local_60,"Usage: test [OPTIONS]");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>(local_28,"Foo",(allocator<char> *)&local_60);
    juzzlin::Argengine::setHelpText(&ae,local_28);
    std::__cxx11::string::~string(local_28);
    juzzlin::Argengine::helpText_abi_cxx11_();
    bVar1 = std::operator==(&local_60,"Foo");
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_60);
      juzzlin::Argengine::~Argengine(&ae);
      return;
    }
    __assertion = "ae.helpText() == \"Foo\"";
    __line = 0x6e;
  }
  else {
    __assertion = "ae.helpText() == \"Usage: test [OPTIONS]\"";
    __line = 0x6c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/help_test/help_test.cpp"
                ,__line,"void testSetGetHelpText_ShouldSucceed()");
}

Assistant:

void testSetGetHelpText_ShouldSucceed()
{
    Argengine ae({ "test" });
    assert(ae.helpText() == "Usage: test [OPTIONS]");
    ae.setHelpText("Foo");
    assert(ae.helpText() == "Foo");
}